

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void MemberExpression_dot_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_70 [8];
  JsValue r5;
  JsValue r2;
  JsValue r1;
  JsAstMemberExpressionDotNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&r5.u + 8));
  JsToObject((JsValue *)((long)&r5.u + 8),(JsValue *)local_70);
  res->type = JS_REFERENCE;
  (res->u).number = (double)r5._0_8_;
  (res->u).reference.name = (char *)na[1].location;
  return;
}

Assistant:

static void
MemberExpression_dot_eval(na, context, res)
	struct JsAstNode *na; /* (struct MemberExpression_dot_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstMemberExpressionDotNode *n = 
		CAST_NODE(na, JsAstMemberExpressionDotNode);
	struct JsValue r1, r2, r5;

	EVAL(n->mexp, context, &r1);
	JsGetValue( &r1, &r2);
	JsToObject(&r2, &r5);
	res->type = JS_REFERENCE;
	res->u.reference.base = r5.u.object;
	res->u.reference.name = n->name;

}